

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

int __thiscall luna::Lexer::LexNumber(Lexer *this,TokenDetail *detail)

{
  int iVar1;
  uint uVar2;
  function<bool_(int)> *in_RSI;
  char cVar3;
  long in_RDI;
  int next;
  bool integer_part;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  function<bool_(int)> *in_stack_fffffffffffffee8;
  function<bool_(int)> *in_stack_fffffffffffffef0;
  function<bool_(int)> *this_00;
  TokenDetail *in_stack_fffffffffffffef8;
  TokenDetail *detail_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  TokenDetail local_c0;
  function<bool_(int)> local_98 [3];
  int local_20;
  byte local_19;
  function<bool_(int)> *local_18;
  int local_4;
  
  local_19 = 0;
  local_18 = in_RSI;
  std::__cxx11::string::clear();
  if (*(int *)(in_RDI + 0x30) == 0x30) {
    local_20 = Next((Lexer *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if ((local_20 == 0x78) || (local_20 == 0x58)) {
      cVar3 = (char)in_RDI + '@';
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      iVar1 = Next((Lexer *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      *(int *)(in_RDI + 0x30) = iVar1;
      std::function<bool(int)>::function<bool(&)(int),void>
                (in_stack_fffffffffffffef0,(_func_bool_int *)in_stack_fffffffffffffee8);
      std::function<bool(int)>::function<luna::Lexer::LexNumber(luna::TokenDetail*)::__0,void>
                (in_stack_fffffffffffffef0,(anon_class_1_0_00000001 *)in_stack_fffffffffffffee8);
      local_4 = LexNumberX((Lexer *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           in_stack_fffffffffffffef8,
                           SUB81((ulong)in_stack_fffffffffffffef0 >> 0x38,0),
                           in_stack_fffffffffffffee8,
                           (function<bool_(int)> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      std::function<bool_(int)>::~function((function<bool_(int)> *)0x1bacd6);
      std::function<bool_(int)>::~function((function<bool_(int)> *)0x1bace3);
      return local_4;
    }
    std::__cxx11::string::push_back((char)in_RDI + '@');
    *(int *)(in_RDI + 0x30) = local_20;
    local_19 = 1;
  }
  uVar2 = (uint)local_19;
  this_00 = local_98;
  std::function<bool(int)>::function<luna::Lexer::LexNumber(luna::TokenDetail*)::__1,void>
            (this_00,(anon_class_1_0_00000001 *)local_18);
  detail_00 = &local_c0;
  std::function<bool(int)>::function<luna::Lexer::LexNumber(luna::TokenDetail*)::__2,void>
            (this_00,(anon_class_1_0_00000001 *)local_18);
  local_4 = LexNumberX((Lexer *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       detail_00,SUB81((ulong)this_00 >> 0x38,0),local_18,
                       (function<bool_(int)> *)CONCAT44(uVar2,in_stack_fffffffffffffee0));
  std::function<bool_(int)>::~function((function<bool_(int)> *)0x1badcd);
  std::function<bool_(int)>::~function((function<bool_(int)> *)0x1badda);
  return local_4;
}

Assistant:

int Lexer::LexNumber(TokenDetail *detail)
    {
        bool integer_part = false;
        token_buffer_.clear();
        if (current_ == '0')
        {
            int next = Next();
            if (next == 'x' || next == 'X')
            {
                token_buffer_.push_back(current_);
                token_buffer_.push_back(next);
                current_ = Next();

                return LexNumberX(detail, false, IsHexChar,
                                  [](int c) { return c == 'p' || c == 'P'; });
            }
            else
            {
                token_buffer_.push_back(current_);
                current_ = next;
                integer_part = true;
            }
        }

        return LexNumberX(detail, integer_part,
                          [](int c) { return isdigit(c) != 0; },
                          [](int c) { return c == 'e' || c == 'E'; });
    }